

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O3

int lj_ffh_bit_lshift(lua_State *L)

{
  long *plVar1;
  TValue *pTVar2;
  undefined2 uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  void *pvVar6;
  int iVar7;
  CTypeID id;
  CTypeID id2;
  CTypeID local_38 [2];
  
  local_38[0] = 0;
  local_38[1] = 0;
  uVar4 = lj_carith_check64(L,1,local_38);
  iVar7 = 2;
  uVar5 = lj_carith_check64(L,2,local_38 + 1);
  if (local_38[0] == 0) {
    L->base[1].n = (double)(int)uVar5;
    iVar7 = 0;
  }
  else {
    uVar4 = lj_carith_shift64(uVar4,(int)uVar5,*(byte *)((ulong)L->base[-1].u32.lo + 6) - 0x43);
    uVar3 = (undefined2)local_38[0];
    pvVar6 = lj_mem_newgco(L,0x10);
    *(undefined1 *)((long)pvVar6 + 5) = 10;
    *(undefined2 *)((long)pvVar6 + 6) = uVar3;
    plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xe0);
    *plVar1 = *plVar1 + 1;
    *(uint64_t *)((long)pvVar6 + 8) = uVar4;
    pTVar2 = L->base;
    pTVar2[-1].u32.lo = (uint32_t)pvVar6;
    *(undefined4 *)((long)pTVar2 + -4) = 0xfffffff5;
  }
  return iVar7;
}

Assistant:

LJLIB_ASM(bit_lshift)		LJLIB_REC(bit_shift IR_BSHL)
{
#if LJ_HASFFI
  CTypeID id = 0, id2 = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  int32_t sh = (int32_t)lj_carith_check64(L, 2, &id2);
  if (id) {
    x = lj_carith_shift64(x, sh, curr_func(L)->c.ffid - (int)FF_bit_lshift);
    return bit_result64(L, id, x);
  }
  setintV(L->base+1, sh);
  return FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  bit_checkbit(L, 2);
  return FFH_RETRY;
#endif
}